

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_polymorphism.h
# Opt level: O0

void density_tests::
     polymorphic_consume<density_tests::MultipleDerived,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>::consume_operation>
               (consume_operation *i_consume)

{
  bool bVar1;
  int iVar2;
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  *prVar3;
  MultipleDerived *pMVar4;
  void *i_address;
  size_t i_alignment;
  MultipleDerived *element_ptr;
  void *untyped_element_ptr;
  void *unaligned_element_ptr;
  consume_operation *i_consume_local;
  
  prVar3 = density::
           lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
           ::consume_operation::complete_type(i_consume);
  bVar1 = density::
          runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
          ::is<density_tests::MultipleDerived>(prVar3);
  if (!bVar1) {
    detail::assert_failed<>
              ("i_consume.complete_type().template is<EXPECTED_TYPE>()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/complex_polymorphism.h"
               ,0x93);
  }
  pMVar4 = density::
           lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
           ::consume_operation::element<density_tests::MultipleDerived>(i_consume);
  MultipleDerived::check(pMVar4);
  pMVar4 = density::
           lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
           ::consume_operation::element<density_tests::MultipleDerived>(i_consume);
  iVar2 = (**(pMVar4->super_Derived1)._vptr_Derived1)();
  if (iVar2 != 0x1e) {
    detail::assert_failed<>
              ("i_consume.template element<EXPECTED_TYPE>().class_id() == EXPECTED_TYPE::s_class_id"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/complex_polymorphism.h"
               ,0x9a);
  }
  i_address = density::
              lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
              ::consume_operation::unaligned_element_ptr(i_consume);
  prVar3 = density::
           lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
           ::consume_operation::complete_type(i_consume);
  i_alignment = density::
                runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                ::alignment(prVar3);
  pMVar4 = (MultipleDerived *)density::address_upper_align(i_address,i_alignment);
  MultipleDerived::check(pMVar4);
  iVar2 = (**(pMVar4->super_Derived1)._vptr_Derived1)();
  if (iVar2 != 0x1e) {
    detail::assert_failed<>
              ("element_ptr->class_id() == EXPECTED_TYPE::s_class_id",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/complex_polymorphism.h"
               ,0xa1);
  }
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::consume_operation::commit(i_consume);
  return;
}

Assistant:

void polymorphic_consume(CONSUME_OPERATION i_consume)
    {
        DENSITY_TEST_ASSERT(i_consume.complete_type().template is<EXPECTED_TYPE>());

        //i_consume.element_ptr()->check();
        i_consume.template element<EXPECTED_TYPE>().check();

        //DENSITY_TEST_ASSERT(i_consume.element_ptr()->class_id() == EXPECTED_TYPE::s_class_id);
        DENSITY_TEST_ASSERT(
          i_consume.template element<EXPECTED_TYPE>().class_id() == EXPECTED_TYPE::s_class_id);

        auto const unaligned_element_ptr = i_consume.unaligned_element_ptr();
        auto const untyped_element_ptr   = density::address_upper_align(
          unaligned_element_ptr, i_consume.complete_type().alignment());
        auto const element_ptr = static_cast<EXPECTED_TYPE *>(untyped_element_ptr);
        element_ptr->check();
        DENSITY_TEST_ASSERT(element_ptr->class_id() == EXPECTED_TYPE::s_class_id);

        i_consume.commit();
    }